

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void setb_(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  ulong uVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  uint uVar11;
  
  if ((((pMyDisasm->Reserved_).EVEX.state == '\x01') || ((pMyDisasm->Reserved_).VEX.state != '\x01')
      ) || ((pMyDisasm->Reserved_).VEX.L != '\0')) {
    if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
      (pMyDisasm->Instruction).Category = 0x10005;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"setb",5);
      (pMyDisasm->Reserved_).OperandSize = 8;
      (pMyDisasm->Reserved_).MemDecoration = 1;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = 0x20;
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar3 = EFLAGS_TABLE[0x5f].SF_;
      UVar5 = EFLAGS_TABLE[0x5f].ZF_;
      UVar6 = EFLAGS_TABLE[0x5f].AF_;
      UVar7 = EFLAGS_TABLE[0x5f].PF_;
      UVar8 = EFLAGS_TABLE[0x5f].CF_;
      UVar9 = EFLAGS_TABLE[0x5f].TF_;
      UVar10 = EFLAGS_TABLE[0x5f].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x5f].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar3;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar5;
      (pMyDisasm->Instruction).Flags.AF_ = UVar6;
      (pMyDisasm->Instruction).Flags.PF_ = UVar7;
      (pMyDisasm->Instruction).Flags.CF_ = UVar8;
      (pMyDisasm->Instruction).Flags.TF_ = UVar9;
      (pMyDisasm->Instruction).Flags.IF_ = UVar10;
      UVar3 = EFLAGS_TABLE[0x5f].NT_;
      UVar5 = EFLAGS_TABLE[0x5f].RF_;
      UVar6 = EFLAGS_TABLE[0x5f].alignment;
      (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x5f].DF_;
      (pMyDisasm->Instruction).Flags.NT_ = UVar3;
      (pMyDisasm->Instruction).Flags.RF_ = UVar5;
      (pMyDisasm->Instruction).Flags.alignment = UVar6;
      return;
    }
  }
  else {
    uVar4 = (pMyDisasm->Reserved_).EndOfBlock;
    if ((uVar4 != 0) && (uVar4 < (pMyDisasm->Reserved_).EIP_ + 2)) {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
      return;
    }
    uVar11 = (uint)(*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar11;
    if (uVar11 == 3) {
      UVar3 = (pMyDisasm->Reserved_).VEX.pp;
      if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
        if (UVar3 == '\0') {
          (pMyDisasm->Instruction).Category = 0x140000;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kmovw",6);
        }
        else if (UVar3 == '\x03') {
          (pMyDisasm->Instruction).Category = 0x140000;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kmovd",6);
        }
        else {
          if (UVar3 != '\x01') goto LAB_00122d8d;
          (pMyDisasm->Instruction).Category = 0x140000;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kmovb",6);
        }
        (pMyDisasm->Reserved_).OperandSize = 0x20;
      }
      else {
        if (UVar3 != '\x03') goto LAB_00122d8d;
        (pMyDisasm->Instruction).Category = 0x140000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kmovq",6);
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 0x400;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      return;
    }
  }
LAB_00122d8d:
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ setb_(PDISASM pMyDisasm)
{
  if (
      (GV.EVEX.state != InUsePrefix) &&
      (GV.VEX.state == InUsePrefix) &&
      (GV.VEX.L == 0)
    ) {
      if (!Security(2, pMyDisasm)) return;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ == 0x3) {
        if (GV.REX.W_ == 0) {
          if (GV.VEX.pp == 1) {
            pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovb");
            #endif
            GV.OperandSize = 32;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            GV.Register_ = OPMASK_REG;
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_ += GV.DECALAGE_EIP+2;
          }
          else if (GV.VEX.pp == 0) {
            pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovw");
            #endif
            GV.OperandSize = 32;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            GV.Register_ = OPMASK_REG;
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_ += GV.DECALAGE_EIP+2;
          }
          else if (GV.VEX.pp == 3) {
            pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovd");
            #endif
            GV.OperandSize = 32;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            GV.Register_ = OPMASK_REG;
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_ += GV.DECALAGE_EIP+2;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else {
          if (GV.VEX.pp == 3) {
            pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovq");
            #endif
            GV.OperandSize = 64;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            GV.Register_ = OPMASK_REG;
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_ += GV.DECALAGE_EIP+2;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
      }
      else {
        failDecode(pMyDisasm);
      }
  }
  else if (GV.VEX.state != InUsePrefix){
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "setb");
    #endif
    GV.MemDecoration = Arg1byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
    GV.OperandSize = 32;
    GV.EIP_+= GV.DECALAGE_EIP+2;
    FillFlags(pMyDisasm,95);
  }
  else {
    failDecode(pMyDisasm);
  }

}